

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPlayTree.h
# Opt level: O1

SPlayTree<int> * __thiscall BinTrees::SPlayTree<int>::i<int_const&>(SPlayTree<int> *this,int *v)

{
  int iVar1;
  BinTree<int> *x;
  BinTree<int> *pBVar2;
  BinTree<int> *pBVar3;
  BinTree<int> *pBVar4;
  runtime_error *this_00;
  int iVar5;
  BinTree<int> *x_00;
  BinTree<int> **ppBVar6;
  BinTree<int> *local_28;
  
  ppBVar6 = &local_28;
  iVar1 = *v;
  local_28 = (BinTree<int> *)this;
  iVar5 = (this->super_BinSTree<int>).super_BinTree<int>.v;
  if (iVar5 != iVar1) {
    do {
      if (iVar5 < iVar1) {
        ppBVar6 = &local_28->r;
        pBVar4 = local_28->r;
      }
      else {
        ppBVar6 = &local_28->l;
        pBVar4 = local_28->l;
      }
      if (pBVar4 == (BinTree<int> *)0x0) break;
      local_28 = *ppBVar6;
      iVar5 = local_28->v;
      ppBVar6 = &local_28;
    } while (iVar5 != iVar1);
  }
  if (*ppBVar6 != (BinTree<int> *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Repeated insert.");
LAB_00102852:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pBVar4 = (BinTree<int> *)operator_new(0x20);
  pBVar4->v = iVar1;
  pBVar4->l = (BinTree<int> *)0x0;
  pBVar4->r = (BinTree<int> *)0x0;
  pBVar4->p = local_28;
  *ppBVar6 = pBVar4;
  do {
    while( true ) {
      x_00 = pBVar4->p;
      if (x_00 == (BinTree<int> *)0x0) {
        return this;
      }
      x = x_00->p;
      if (x != (BinTree<int> *)0x0) break;
      if (pBVar4 == x_00->l) goto LAB_0010281b;
LAB_00102805:
      this = (SPlayTree<int> *)BinSTree<int>::LR(&this->super_BinSTree<int>,(BinSTree<int> *)x_00);
    }
    pBVar2 = x->l;
    if ((pBVar2 == (BinTree<int> *)0x0) || (pBVar4 != pBVar2->l)) {
      pBVar3 = x->r;
      if ((pBVar3 == (BinTree<int> *)0x0) || (pBVar4 != pBVar3->r)) {
        if ((pBVar2 != (BinTree<int> *)0x0) && (pBVar4 == pBVar2->r)) {
          this = (SPlayTree<int> *)
                 BinSTree<int>::LR(&this->super_BinSTree<int>,(BinSTree<int> *)x_00);
          goto LAB_00102814;
        }
        if ((pBVar3 == (BinTree<int> *)0x0) || (pBVar4 != pBVar3->l)) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"whoops!");
          goto LAB_00102852;
        }
        this = (SPlayTree<int> *)BinSTree<int>::RR(&this->super_BinSTree<int>,(BinSTree<int> *)x_00)
        ;
      }
      else {
        this = (SPlayTree<int> *)BinSTree<int>::LR(&this->super_BinSTree<int>,(BinSTree<int> *)x);
      }
      x_00 = pBVar4->p;
      goto LAB_00102805;
    }
    this = (SPlayTree<int> *)BinSTree<int>::RR(&this->super_BinSTree<int>,(BinSTree<int> *)x);
LAB_00102814:
    x_00 = pBVar4->p;
LAB_0010281b:
    this = (SPlayTree<int> *)BinSTree<int>::RR(&this->super_BinSTree<int>,(BinSTree<int> *)x_00);
  } while( true );
}

Assistant:

SPlayTree<T> *SPlayTree<T>::i(F &&v) {
        BinTree<T> *xp = nullptr;
        BinTree<T> *&ip = this->unsafe_search(v, xp);
        auto root = this;
        if (ip) throw std::runtime_error("Repeated insert.");
        else {
            ip = new SPlayTree(std::forward<F>(v), xp);
        }
        auto i = static_cast<SPlayTree<T> *>(ip);
        while (i->P()) {
            if (i->P()->P() == nullptr) {
                if (i == i->p()->l())
                    root = static_cast<SPlayTree<T> *>(root->RR(static_cast<BinSTree<T> *>(i->p())));
                else
                    root = static_cast<SPlayTree<T> *>(root->LR(static_cast<BinSTree<T> *>(i->p())));
            } else if (i->p()->p()->l() && i == i->p()->p()->l()->l()) {
                root = static_cast<SPlayTree<T> *>(root->RR(static_cast<BinSTree<T> *>(i->p()->p())));
                root = static_cast<SPlayTree<T> *>(root->RR(static_cast<BinSTree<T> *>(i->p())));
            } else if (i->p()->p()->r() && i == i->p()->p()->r()->r()) {
                root = static_cast<SPlayTree<T> *>(root->LR(static_cast<BinSTree<T> *>(i->p()->p())));
                root = static_cast<SPlayTree<T> *>(root->LR(static_cast<BinSTree<T> *>(i->p())));
            } else if (i->p()->p()->l() && i == i->p()->p()->l()->r()) {
                root = static_cast<SPlayTree<T> *>(root->LR(static_cast<BinSTree<T> *>(i->p())));
                root = static_cast<SPlayTree<T> *>(root->RR(static_cast<BinSTree<T> *>(i->p())));
            } else if (i->p()->p()->r() && i == i->p()->p()->r()->l()) {
                root = static_cast<SPlayTree<T> *>(root->RR(static_cast<BinSTree<T> *>(i->p())));
                root = static_cast<SPlayTree<T> *>(root->LR(static_cast<BinSTree<T> *>(i->p())));
            } else throw std::runtime_error("whoops!");
        }

        return root;
    }